

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O0

int check_keyword(void)

{
  int iVar1;
  int local_10;
  int local_c;
  int i;
  int op;
  
  local_c = 0;
  for (local_10 = 0; local_c == 0 && local_10 < 10; local_10 = local_10 + 1) {
    if (((keyword[local_10].machine_type == -1) || (machine->type == keyword[local_10].machine_type)
        ) && (iVar1 = strcasecmp(symbol,keyword[local_10].name), iVar1 == 0)) {
      local_c = keyword[local_10].op;
    }
  }
  if (local_c != 0) {
    expr_lablptr = (t_symbol *)0x0;
    expr_lablcnt = 0;
  }
  return local_c;
}

Assistant:

int
check_keyword(void)
{
	int op = 0;
	int i;
	/* check if its an assembler function */
	for(i=0; (0 == op) && (i<10); i++)
	{
		if(((MACHINE_ALL == keyword[i].machine_type) || (machine->type == keyword[i].machine_type)) && 
			(!strcasecmp(symbol, keyword[i].name)))
		{
			op = keyword[i].op;
		}
	}
	/* extra setup for functions that send back symbol infos */
	if(op)
	{
		expr_lablptr = NULL;
		expr_lablcnt = 0;
	}
	/* ok */
	return (op);
}